

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

void Fra_SmlNodeSimulate(Fra_Sml_t *p,Aig_Obj_t *pObj,int iFrame)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x1e9,"void Fra_SmlNodeSimulate(Fra_Sml_t *, Aig_Obj_t *, int)");
  }
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    if (iFrame == 0) {
      iVar4 = p->nWordsFrame;
      iVar12 = p->nWordsTotal;
    }
    else {
      iVar4 = p->nWordsFrame;
      iVar12 = p->nWordsTotal;
      if (iVar12 <= iVar4) {
        __assert_fail("iFrame == 0 || p->nWordsFrame < p->nWordsTotal",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                      ,0x1eb,"void Fra_SmlNodeSimulate(Fra_Sml_t *, Aig_Obj_t *, int)");
      }
    }
    pAVar1 = pObj->pFanin0;
    pAVar2 = pObj->pFanin1;
    if (pAVar1 == (Aig_Obj_t *)0x0) {
      uVar11 = 1;
    }
    else {
      uVar11 = ((uint)pAVar1 ^ *(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) >> 3) & 1;
    }
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      bVar9 = 1;
    }
    else {
      bVar9 = ((byte)pAVar2 ^ (byte)(*(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) >> 3)) &
              1;
    }
    lVar10 = (long)(pObj->Id * iVar12);
    lVar5 = (long)(iVar4 * iFrame);
    lVar6 = (long)(*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24) * iVar12);
    lVar8 = (long)(iVar12 * *(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24));
    uVar3 = *(uint *)&pObj->field_0x18 >> 3;
    if ((uVar11 == 0) || (bVar9 == 0)) {
      if (uVar11 == 0 || bVar9 != 0) {
        lVar5 = lVar5 * 4;
        if ((uVar11 == 0 & bVar9) == 1) {
          if ((uVar3 & 1) == 0) {
            for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
              *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
                   ~*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4) &
                   *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4);
            }
          }
          else {
            for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
              *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
                   ~*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4) |
                   *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4);
            }
          }
        }
        else if ((uVar3 & 1) == 0) {
          for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
            *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
                 *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4) &
                 *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4);
          }
        }
        else {
          for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
            *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
                 ~(*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4) &
                  *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4));
          }
        }
      }
      else {
        lVar5 = lVar5 * 4;
        if ((uVar3 & 1) == 0) {
          for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
            *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
                 ~*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4) &
                 *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4);
          }
        }
        else {
          for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
            *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
                 ~*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4) |
                 *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4);
          }
        }
      }
    }
    else {
      lVar5 = lVar5 * 4;
      if ((uVar3 & 1) == 0) {
        for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
          *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
               ~(*(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4) |
                *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4));
        }
      }
      else {
        for (lVar7 = 0; lVar7 < p->nWordsFrame; lVar7 = lVar7 + 1) {
          *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar10 * 4) =
               *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar8 * 4) |
               *(uint *)((long)&p[1].pAig + lVar7 * 4 + lVar5 + lVar6 * 4);
        }
      }
    }
    return;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                ,0x1ea,"void Fra_SmlNodeSimulate(Fra_Sml_t *, Aig_Obj_t *, int)");
}

Assistant:

void Fra_SmlNodeSimulate( Fra_Sml_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pSims, * pSims0, * pSims1;
    int fCompl, fCompl0, fCompl1, i;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_ObjIsNode(pObj) );
    assert( iFrame == 0 || p->nWordsFrame < p->nWordsTotal );
    // get hold of the simulation information
    pSims  = Fra_ObjSim(p, pObj->Id) + p->nWordsFrame * iFrame;
    pSims0 = Fra_ObjSim(p, Aig_ObjFanin0(pObj)->Id) + p->nWordsFrame * iFrame;
    pSims1 = Fra_ObjSim(p, Aig_ObjFanin1(pObj)->Id) + p->nWordsFrame * iFrame;
    // get complemented attributes of the children using their random info
    fCompl  = pObj->fPhase;
    fCompl0 = Aig_ObjPhaseReal(Aig_ObjChild0(pObj));
    fCompl1 = Aig_ObjPhaseReal(Aig_ObjChild1(pObj));
    // simulate
    if ( fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] | pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = ~(pSims0[i] | pSims1[i]);
    }
    else if ( fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] | ~pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (~pSims0[i] & pSims1[i]);
    }
    else if ( !fCompl0 && fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (~pSims0[i] | pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] & ~pSims1[i]);
    }
    else // if ( !fCompl0 && !fCompl1 )
    {
        if ( fCompl )
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = ~(pSims0[i] & pSims1[i]);
        else
            for ( i = 0; i < p->nWordsFrame; i++ )
                pSims[i] = (pSims0[i] & pSims1[i]);
    }
}